

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Document::parseYAMLDirective(Document *this)

{
  Token local_48;
  Document *local_10;
  Document *this_local;
  
  local_10 = this;
  getNext(&local_48,this);
  Token::~Token(&local_48);
  return;
}

Assistant:

void Document::parseYAMLDirective() {
  getNext(); // Eat %YAML <version>
}